

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

void FreeContent(SUNNonlinearSolver NLS)

{
  long *in_RDI;
  
  if (*(long *)(*in_RDI + 0x68) != 0) {
    N_VDestroy(*(undefined8 *)(*in_RDI + 0x68));
    *(undefined8 *)(*in_RDI + 0x68) = 0;
  }
  if (*(long *)(*in_RDI + 0x70) != 0) {
    N_VDestroy(*(undefined8 *)(*in_RDI + 0x70));
    *(undefined8 *)(*in_RDI + 0x70) = 0;
  }
  if (*(long *)(*in_RDI + 0x78) != 0) {
    N_VDestroy(*(undefined8 *)(*in_RDI + 0x78));
    *(undefined8 *)(*in_RDI + 0x78) = 0;
  }
  if (*(long *)(*in_RDI + 0x80) != 0) {
    N_VDestroy(*(undefined8 *)(*in_RDI + 0x80));
    *(undefined8 *)(*in_RDI + 0x80) = 0;
  }
  if (*(long *)(*in_RDI + 0x88) != 0) {
    N_VDestroy(*(undefined8 *)(*in_RDI + 0x88));
    *(undefined8 *)(*in_RDI + 0x88) = 0;
  }
  if (*(long *)(*in_RDI + 0x18) != 0) {
    free(*(void **)(*in_RDI + 0x18));
    *(undefined8 *)(*in_RDI + 0x18) = 0;
  }
  if (*(long *)(*in_RDI + 0x30) != 0) {
    free(*(void **)(*in_RDI + 0x30));
    *(undefined8 *)(*in_RDI + 0x30) = 0;
  }
  if (*(long *)(*in_RDI + 0x38) != 0) {
    free(*(void **)(*in_RDI + 0x38));
    *(undefined8 *)(*in_RDI + 0x38) = 0;
  }
  if (*(long *)(*in_RDI + 0x40) != 0) {
    free(*(void **)(*in_RDI + 0x40));
    *(undefined8 *)(*in_RDI + 0x40) = 0;
  }
  if (*(long *)(*in_RDI + 0x48) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x48),*(undefined4 *)(*in_RDI + 0x10));
    *(undefined8 *)(*in_RDI + 0x48) = 0;
  }
  if (*(long *)(*in_RDI + 0x50) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x50),*(undefined4 *)(*in_RDI + 0x10));
    *(undefined8 *)(*in_RDI + 0x50) = 0;
  }
  if (*(long *)(*in_RDI + 0x58) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(*in_RDI + 0x58),*(undefined4 *)(*in_RDI + 0x10));
    *(undefined8 *)(*in_RDI + 0x58) = 0;
  }
  if (*(long *)(*in_RDI + 0x60) != 0) {
    free(*(void **)(*in_RDI + 0x60));
    *(undefined8 *)(*in_RDI + 0x60) = 0;
  }
  return;
}

Assistant:

static void FreeContent(SUNNonlinearSolver NLS)
{
  if (FP_CONTENT(NLS)->yprev)
  {
    N_VDestroy(FP_CONTENT(NLS)->yprev);
    FP_CONTENT(NLS)->yprev = NULL;
  }

  if (FP_CONTENT(NLS)->gy)
  {
    N_VDestroy(FP_CONTENT(NLS)->gy);
    FP_CONTENT(NLS)->gy = NULL;
  }

  if (FP_CONTENT(NLS)->fold)
  {
    N_VDestroy(FP_CONTENT(NLS)->fold);
    FP_CONTENT(NLS)->fold = NULL;
  }

  if (FP_CONTENT(NLS)->gold)
  {
    N_VDestroy(FP_CONTENT(NLS)->gold);
    FP_CONTENT(NLS)->gold = NULL;
  }

  if (FP_CONTENT(NLS)->delta)
  {
    N_VDestroy(FP_CONTENT(NLS)->delta);
    FP_CONTENT(NLS)->delta = NULL;
  }

  if (FP_CONTENT(NLS)->imap)
  {
    free(FP_CONTENT(NLS)->imap);
    FP_CONTENT(NLS)->imap = NULL;
  }

  if (FP_CONTENT(NLS)->R)
  {
    free(FP_CONTENT(NLS)->R);
    FP_CONTENT(NLS)->R = NULL;
  }

  if (FP_CONTENT(NLS)->gamma)
  {
    free(FP_CONTENT(NLS)->gamma);
    FP_CONTENT(NLS)->gamma = NULL;
  }

  if (FP_CONTENT(NLS)->cvals)
  {
    free(FP_CONTENT(NLS)->cvals);
    FP_CONTENT(NLS)->cvals = NULL;
  }

  if (FP_CONTENT(NLS)->df)
  {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->df, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->df = NULL;
  }

  if (FP_CONTENT(NLS)->dg)
  {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->dg, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->dg = NULL;
  }

  if (FP_CONTENT(NLS)->q)
  {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->q, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->q = NULL;
  }

  if (FP_CONTENT(NLS)->Xvecs)
  {
    free(FP_CONTENT(NLS)->Xvecs);
    FP_CONTENT(NLS)->Xvecs = NULL;
  }

  return;
}